

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<4U>::
impl<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&),_boost::python::default_call_policies,_boost::mpl::vector5<void,_PythonModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&>_>
::operator()(impl<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&),_boost::python::default_call_policies,_boost::mpl::vector5<void,_PythonModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  PyTypeObject *pPVar2;
  PyObject *pPVar3;
  c_t3 c3;
  c_t0 c0;
  c_t2 c2;
  c_t1 c1;
  long local_c0;
  long local_b8;
  undefined4 local_ac;
  undefined1 local_a8 [16];
  long *local_98 [2];
  long local_88 [2];
  PyTypeObject *local_78;
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [2];
  _object *local_38;
  
  local_b8 = converter::get_lvalue_from_python
                       ((_object *)args_[1].ob_type,
                        converter::detail::registered_base<PythonModuleClient_const_volatile&>::
                        converters);
  if (local_b8 != 0) {
    p_Var1 = (_object *)args_[2].ob_refcnt;
    local_68 = converter::rvalue_from_python_stage1
                         (p_Var1,converter::detail::
                                 registered_base<std::__cxx11::string_const_volatile&>::converters);
    if (local_68._0_8_ != 0) {
      pPVar2 = args_[2].ob_type;
      local_38 = p_Var1;
      local_a8 = converter::rvalue_from_python_stage1
                           ((_object *)pPVar2,
                            converter::detail::registered_base<std::__cxx11::string_const_volatile&>
                            ::converters);
      local_78 = pPVar2;
      if (local_a8._0_8_ == 0) {
        pPVar3 = (PyObject *)0x0;
      }
      else {
        local_c0 = converter::get_lvalue_from_python
                             ((_object *)args_[3].ob_refcnt,
                              converter::detail::registered_base<TrodesMsg_const_volatile&>::
                              converters);
        if (local_c0 == 0) {
          pPVar3 = (PyObject *)0x0;
        }
        else {
          local_ac = 0;
          pPVar3 = invoke<int,void(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string,TrodesMsg&),boost::python::arg_from_python<PythonModuleClient&>,boost::python::arg_from_python<std::__cxx11::string>,boost::python::arg_from_python<std::__cxx11::string>,boost::python::arg_from_python<TrodesMsg&>>
                             (&local_ac,this,&local_b8,local_68,local_a8,&local_c0);
        }
        if (((long **)local_a8._0_8_ == local_98) && (local_98[0] != local_88)) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
      }
      if ((long **)local_68._0_8_ != local_58) {
        return pPVar3;
      }
      if (local_58[0] == local_48) {
        return pPVar3;
      }
      operator_delete(local_58[0],local_48[0] + 1);
      return pPVar3;
    }
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }